

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O3

QString * __thiscall
CPP::WriteInitialization::pixCall
          (QString *__return_storage_ptr__,WriteInitialization *this,QLatin1StringView t,
          QString *text)

{
  Uic *pUVar1;
  QTextStream *pQVar2;
  long in_FS_OFFSET;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  QStringBuilder<QLatin1String_&,_QLatin1String> local_60;
  QArrayData local_48;
  long local_38;
  
  local_48.alloc = (qsizetype)t.m_data;
  local_48._0_8_ = t.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((text->d).size == 0) {
    local_60.a = (QLatin1String *)&local_48;
    local_60.b.m_size = 2;
    local_60.b.m_data = "()";
    QStringBuilder<QLatin1String_&,_QLatin1String>::convertTo<QString>
              (__return_storage_ptr__,&local_60);
  }
  else {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
    local_78 = 0xaaaaaaaa;
    uStack_74 = 0xaaaaaaaa;
    uStack_70 = 0xaaaaaaaa;
    uStack_6c = 0xaaaaaaaa;
    QTextStream::QTextStream((QTextStream *)&local_78,__return_storage_ptr__,3);
    QTextStream::operator<<((QTextStream *)&local_78,t);
    QTextStream::operator<<((QTextStream *)&local_78,'(');
    pUVar1 = this->m_uic;
    local_60.a = (QLatin1String *)(pUVar1->pixFunction).d.d;
    local_60.b.m_size = (qsizetype)(pUVar1->pixFunction).d.ptr;
    local_60.b.m_data = (char *)(pUVar1->pixFunction).d.size;
    if ((QArrayData *)local_60.a != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((QArrayData *)local_60.a)->ref_)->ref_)._q_value.super___atomic_base<int>.
      _M_i = (((QArrayData *)&((QArrayData *)local_60.a)->ref_)->ref_)._q_value.
             super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (local_60.b.m_data == (char *)0x0) {
      language::_formatString((QTextStream *)&local_78,text,&this->m_dindent,true);
    }
    else {
      pQVar2 = (QTextStream *)QTextStream::operator<<((QTextStream *)&local_78,(QString *)&local_60)
      ;
      pQVar2 = (QTextStream *)QTextStream::operator<<(pQVar2,'(');
      language::_formatString(pQVar2,text,&this->m_dindent,false);
      QTextStream::operator<<(pQVar2,')');
    }
    QTextStream::operator<<((QTextStream *)&local_78,')');
    if ((QArrayData *)local_60.a != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)&(local_60.a)->m_size)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)&(local_60.a)->m_size)->_q_value).super___atomic_base<int>._M_i + -1
      ;
      UNLOCK();
      if ((((QBasicAtomicInt *)&(local_60.a)->m_size)->_q_value).super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate((QArrayData *)local_60.a,2,0x10);
      }
    }
    QTextStream::~QTextStream((QTextStream *)&local_78);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString WriteInitialization::pixCall(QLatin1StringView t, const QString &text) const
{
    if (text.isEmpty())
        return t % "()"_L1;

    QString result;
    QTextStream str(&result);
    str << t;
    str << '(';
    const QString pixFunc = m_uic->pixmapFunction();
    if (pixFunc.isEmpty())
        str << language::qstring(text, m_dindent);
    else
        str << pixFunc << '(' << language::charliteral(text, m_dindent) << ')';
    str << ')';
    return result;
}